

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O3

gravity_range_t * gravity_range_deserialize(gravity_vm *vm,json_value *json)

{
  char *pcVar1;
  char *__s;
  long lVar2;
  int iVar3;
  ulong uVar4;
  size_t n;
  gravity_range_t *pgVar5;
  long lVar6;
  gravity_int_t local_48;
  gravity_int_t local_40;
  
  uVar4 = (ulong)(json->u).string.length;
  if (uVar4 < 2) {
    local_48 = 0;
    local_40 = 0;
  }
  else {
    lVar6 = 0;
    local_40 = 0;
    local_48 = 0;
    do {
      pcVar1 = (json->u).string.ptr;
      __s = *(char **)(pcVar1 + lVar6 + 0x18);
      lVar2 = *(long *)(pcVar1 + lVar6 + 0x28);
      n = strlen(__s);
      iVar3 = string_casencmp(__s,"from",n);
      if (iVar3 == 0) {
        if (*(int *)(lVar2 + 8) != 3) {
          return (gravity_range_t *)0x0;
        }
        local_40 = *(gravity_int_t *)(lVar2 + 0x10);
      }
      else {
        iVar3 = string_casencmp(__s,"to",n);
        if (iVar3 == 0) {
          if (*(int *)(lVar2 + 8) != 3) {
            return (gravity_range_t *)0x0;
          }
          local_48 = *(gravity_int_t *)(lVar2 + 0x10);
        }
      }
      lVar6 = lVar6 + 0x18;
    } while (uVar4 * 0x18 + -0x18 != lVar6);
  }
  pgVar5 = gravity_range_new(vm,local_40,local_48,true);
  return pgVar5;
}

Assistant:

gravity_range_t *gravity_range_deserialize (gravity_vm *vm, json_value *json) {
    json_int_t from = 0;
    json_int_t to = 0;
    
    uint32_t n = json->u.object.length;
    for (uint32_t i=1; i<n; ++i) { // from 1 to skip type
        const char *label = json->u.object.values[i].name;
        json_value *value = json->u.object.values[i].value;
        size_t label_size = strlen(label);
        
        // from
        if (string_casencmp(label, GRAVITY_JSON_LABELFROM, label_size) == 0) {
            if (value->type != json_integer) goto abort_load;
            from = value->u.integer;
            continue;
        }
        
        // to
        if (string_casencmp(label, GRAVITY_JSON_LABELTO, label_size) == 0) {
            if (value->type != json_integer) goto abort_load;
            to = value->u.integer;
            continue;
        }
    }
    
    return gravity_range_new(vm, (gravity_int_t)from, (gravity_int_t)to, true);
    
abort_load:
    return NULL;
}